

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O1

void __thiscall ot::commissioner::JobManager::CancelCommand(JobManager *this)

{
  pointer ppJVar1;
  uint uVar2;
  pointer ppJVar3;
  CommissionerAppPtr commissioner;
  Error error;
  CommissionerAppPtr local_a8;
  ErrorCode local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_58 [56];
  
  local_a8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_a8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98 = 0;
  local_88 = 0;
  local_80[0] = 0;
  ppJVar3 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppJVar1 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_90 = local_80;
  while( true ) {
    if (ppJVar3 == ppJVar1) {
      WaitForJobs(this);
      GetSelectedCommissioner((Error *)local_70,this,&local_a8);
      local_98 = local_70._0_4_;
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_68);
      if (local_68._M_p != local_58) {
        operator_delete(local_68._M_p);
      }
      if (local_98 == kNone) {
        uVar2 = (*((local_a8.
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
        (*((local_a8.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[(ulong)(uVar2 & 0xff) + 0xd])();
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_a8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    if (*ppJVar3 == (Job *)0x0) break;
    Job::Cancel(*ppJVar3);
    ppJVar3 = ppJVar3 + 1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x284,"void ot::commissioner::JobManager::CancelCommand()");
}

Assistant:

void JobManager::CancelCommand()
{
    CommissionerAppPtr commissioner = nullptr;
    Error              error        = ERROR_NONE;

    for (auto job : mJobPool)
    {
        ASSERT(job != nullptr);
        job->Cancel();
    }
    WaitForJobs();

    error = GetSelectedCommissioner(commissioner);
    if (error == ERROR_NONE)
    {
        if (commissioner->IsActive())
        {
            commissioner->CancelRequests();
        }
        else
        {
            commissioner->Stop();
        }
    }
}